

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# misc_helper.c
# Opt level: O0

void helper_store_dpdes(CPUPPCState_conflict2 *env,target_ulong val)

{
  ArchCPU_conflict18 *cpu_00;
  CPUState *cs;
  PowerPCCPU_conflict3 *cpu;
  target_ulong val_local;
  CPUPPCState_conflict2 *env_local;
  
  cpu_00 = env_archcpu(env);
  helper_hfscr_facility_check_ppc64(env,0x400,"store DPDES",10);
  if ((val & 0xfffffffffffffffe) == 0) {
    if ((val & 1) == 0) {
      env->pending_interrupts = env->pending_interrupts & 0xffffbfff;
    }
    else {
      env->pending_interrupts = env->pending_interrupts | 0x4000;
      cpu_interrupt(&cpu_00->parent_obj,2);
    }
  }
  return;
}

Assistant:

void helper_store_dpdes(CPUPPCState *env, target_ulong val)
{
    PowerPCCPU *cpu = env_archcpu(env);
    CPUState *cs = CPU(cpu);

    helper_hfscr_facility_check(env, HFSCR_MSGP, "store DPDES", HFSCR_IC_MSGP);

    /* TODO: TCG supports only one thread */
    if (val & ~0x1) {
        qemu_log_mask(LOG_GUEST_ERROR, "Invalid DPDES register value "
                      TARGET_FMT_lx"\n", val);
        return;
    }

    if (val & 0x1) {
        env->pending_interrupts |= 1 << PPC_INTERRUPT_DOORBELL;
        cpu_interrupt(cs, CPU_INTERRUPT_HARD);
    } else {
        env->pending_interrupts &= ~(1 << PPC_INTERRUPT_DOORBELL);
    }
}